

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O3

void __thiscall cmComputeLinkDepends::LinkEntry::LinkEntry(LinkEntry *this,LinkEntry *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  (this->Item).Value._M_dataplus._M_p = (pointer)&(this->Item).Value.field_2;
  pcVar1 = (param_1->Item).Value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->Item).Value._M_string_length);
  (this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (param_1->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (param_1->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->Kind = param_1->Kind;
  uVar3 = *(undefined4 *)((long)&param_1->Target + 4);
  uVar4 = *(undefined4 *)&param_1->ObjectSource;
  uVar5 = *(undefined4 *)((long)&param_1->ObjectSource + 4);
  *(undefined4 *)&this->Target = *(undefined4 *)&param_1->Target;
  *(undefined4 *)((long)&this->Target + 4) = uVar3;
  *(undefined4 *)&this->ObjectSource = uVar4;
  *(undefined4 *)((long)&this->ObjectSource + 4) = uVar5;
  (this->Feature)._M_dataplus._M_p = (pointer)&(this->Feature).field_2;
  pcVar1 = (param_1->Feature)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Feature,pcVar1,pcVar1 + (param_1->Feature)._M_string_length);
  return;
}

Assistant:

LinkEntry() = default;